

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

void __thiscall
cmCPackGenerator::DisplayVerboseOutput(cmCPackGenerator *this,string *msg,float progress)

{
  cmCPackLog *this_00;
  ostream *poVar1;
  char *msg_00;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream cmCPackLog_msg;
  float progress_local;
  string *msg_local;
  cmCPackGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"");
  poVar1 = std::operator<<(poVar1,(string *)msg);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = this->Logger;
  std::__cxx11::ostringstream::str();
  msg_00 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(this_00,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x32,msg_00);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void cmCPackGenerator::DisplayVerboseOutput(const std::string& msg,
                                            float progress)
{
  (void)progress;
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "" << msg << std::endl);
}